

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void deqp::gls::FboUtil::config::glDelete(Image *cfg,GLuint img,Functions *gl)

{
  undefined4 in_EAX;
  long lVar1;
  long lVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uStack_18;
  GLuint img_local;
  
  uStack_18 = CONCAT44(img,in_EAX);
  lVar1 = __dynamic_cast(cfg,&Image::typeinfo,&Renderbuffer::typeinfo,0,in_R8,in_R9,uStack_18);
  lVar2 = 0x460;
  if (lVar1 == 0) {
    lVar1 = __dynamic_cast(cfg,&Image::typeinfo,&Texture::typeinfo,0,in_R8,in_R9,uStack_18);
    lVar2 = 0x480;
    if (lVar1 == 0) {
      return;
    }
  }
  (**(code **)((long)&gl->activeShaderProgram + lVar2))(1,&img_local);
  return;
}

Assistant:

static void glDelete (const Image& cfg, GLuint img, const glw::Functions& gl)
{
	if (dynamic_cast<const Renderbuffer*>(&cfg) != DE_NULL)
		gl.deleteRenderbuffers(1, &img);
	else if (dynamic_cast<const Texture*>(&cfg) != DE_NULL)
		gl.deleteTextures(1, &img);
	else
		DE_FATAL("Impossible image type");
}